

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.cpp
# Opt level: O2

bool __thiscall spvtools::opt::IRContext::RemoveCapability(IRContext *this,Capability capability)

{
  Module *pMVar1;
  FeatureManager *this_00;
  bool bVar2;
  inst_iterator local_58;
  inst_iterator local_50;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  
  pMVar1 = (this->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  local_50.super_iterator.node_ =
       *(iterator *)
        ((long)&(pMVar1->capabilities_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
  local_58.super_iterator.node_ =
       (iterator)
       ((long)&(pMVar1->capabilities_).super_IntrusiveList<spvtools::opt::Instruction> + 8);
  local_48._8_8_ = 0;
  local_48._4_4_ = 0;
  local_48._0_4_ = capability;
  local_30 = std::
             _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/ir_context.cpp:284:7)>
             ::_M_invoke;
  local_38 = std::
             _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/ir_context.cpp:284:7)>
             ::_M_manager;
  bVar2 = KillInstructionIf(this,&local_50,&local_58,
                            (function<bool_(spvtools::opt::Instruction_*)> *)&local_48);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  if ((bVar2) &&
     (this_00 = (this->feature_mgr_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
                .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl,
     this_00 != (FeatureManager *)0x0)) {
    FeatureManager::RemoveCapability(this_00,capability);
  }
  return bVar2;
}

Assistant:

bool IRContext::RemoveCapability(spv::Capability capability) {
  const bool removed = KillInstructionIf(
      module()->capability_begin(), module()->capability_end(),
      [capability](Instruction* inst) {
        return static_cast<spv::Capability>(inst->GetSingleWordOperand(0)) ==
               capability;
      });

  if (removed && feature_mgr_ != nullptr) {
    feature_mgr_->RemoveCapability(capability);
  }

  return removed;
}